

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

void __thiscall duckdb::Binder::PopExpressionBinder(Binder *this)

{
  pointer *pprVar1;
  reference<Binder> root;
  shared_ptr<duckdb::Binder,_true> *this_00;
  
  if ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    this_00 = &this->parent;
    do {
      if (this->binder_type != REGULAR_BINDER) break;
      this = shared_ptr<duckdb::Binder,_true>::operator*(this_00);
      this_00 = &this->parent;
    } while ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (element_type *)0x0);
  }
  pprVar1 = &(this->active_binders).
             super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pprVar1 = *pprVar1 + -1;
  return;
}

Assistant:

void Binder::PopExpressionBinder() {
	D_ASSERT(HasActiveBinder());
	GetActiveBinders().pop_back();
}